

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_opt_start(lua_State *L)

{
  GCstr *__s1;
  undefined4 *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  GCstr *pGVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int narg;
  char *pcVar11;
  GCstr *__s1_00;
  char *pcVar12;
  uint uVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  int local_54;
  
  uVar8 = (ulong)(L->glref).ptr32;
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  if (iVar3 == 0) {
    *(uint *)(uVar8 + 0x220) = *(uint *)(uVar8 + 0x220) & 0xf000ffff | 0x3ff0000;
  }
  else if (0 < iVar3) {
    narg = 1;
    do {
      pGVar5 = lj_lib_checkstr(L,narg);
      bVar7 = (char)pGVar5[1].nextgc.gcptr32 - 0x30;
      if ((bVar7 < 10) && (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == '\0')) {
        uVar13 = 0x3ff0000;
        if (bVar7 < 3) {
          uVar13 = *(uint *)(&DAT_0015715c + (ulong)bVar7 * 4);
        }
        *(uint *)(uVar8 + 0x220) = *(uint *)(uVar8 + 0x220) & 0xf000ffff | uVar13;
      }
      else {
        __s1 = pGVar5 + 1;
        cVar2 = (char)(__s1->nextgc).gcptr32;
        if (cVar2 == 'n') {
          if (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == 'o') {
            __s1_00 = (GCstr *)((long)&(__s1->nextgc).gcptr32 +
                               (ulong)(*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 2) == '-') + 2);
            goto LAB_0014b570;
          }
LAB_0014b578:
          local_54 = 0;
          __s1_00 = __s1;
        }
        else if (cVar2 == '-') {
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
LAB_0014b570:
          local_54 = (int)CONCAT71((int7)((ulong)pGVar5 >> 8),1);
        }
        else {
          if (cVar2 != '+') goto LAB_0014b578;
          local_54 = 0;
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
        }
        uVar13 = 0x10000;
        pcVar11 = "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse";
        while( true ) {
          uVar9 = (ulong)(byte)*pcVar11;
          if (uVar9 == 0) {
            iVar4 = 2;
          }
          else {
            iVar4 = strncmp((char *)__s1_00,(char *)((byte *)pcVar11 + 1),uVar9);
            if ((iVar4 == 0) && (*(char *)((long)&(__s1_00->nextgc).gcptr32 + uVar9) == '\0')) {
              if ((char)local_54 == '\0') {
                *(uint *)(uVar8 + 0x220) = *(uint *)(uVar8 + 0x220) | uVar13;
              }
              else {
                *(uint *)(uVar8 + 0x220) = *(uint *)(uVar8 + 0x220) & ~uVar13;
              }
              iVar4 = 1;
            }
            else {
              pcVar11 = (char *)((byte *)pcVar11 + uVar9 + 1);
              iVar4 = 0;
            }
          }
          if (iVar4 != 0) break;
          uVar13 = uVar13 * 2;
        }
        if (iVar4 == 2) {
          lVar10 = 0;
          pcVar11 = 
          "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
          ;
          do {
            uVar9 = (ulong)(byte)*pcVar11;
            iVar4 = strncmp((char *)__s1,(char *)((byte *)pcVar11 + 1),uVar9);
            if ((iVar4 == 0) && (*(char *)((long)&(__s1->nextgc).gcptr32 + uVar9) == '=')) {
              cVar2 = *(char *)((long)&pGVar5[1].nextgc.gcptr32 + uVar9 + 1);
              local_54 = 0;
              if ((byte)(cVar2 - 0x30U) < 10) {
                pcVar12 = (char *)((long)&pGVar5[1].nextgc.gcptr32 + uVar9 + 2);
                iVar4 = 0;
                do {
                  iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                  cVar2 = *pcVar12;
                  pcVar12 = pcVar12 + 1;
                } while ((byte)(cVar2 - 0x30U) < 10);
              }
              else {
                iVar4 = 0;
              }
              if (cVar2 == '\0') {
                *(int *)(uVar8 + 0x790 + lVar10 * 4) = iVar4;
                local_54 = 1;
                if (lVar10 == 5) {
                  auVar16 = ZEXT416(*(int *)(uVar8 + 0x7a4) * 2 - 1);
                  auVar16 = pshuflw(auVar16,auVar16,0);
                  uVar15 = auVar16._0_4_;
                  lVar6 = 0;
                  do {
                    puVar1 = (undefined4 *)(uVar8 + 0xb38 + lVar6 * 2);
                    *puVar1 = uVar15;
                    puVar1[1] = uVar15;
                    puVar1[2] = uVar15;
                    puVar1[3] = uVar15;
                    lVar6 = lVar6 + 8;
                  } while (lVar6 != 0x40);
                }
              }
              bVar14 = false;
            }
            else {
              pcVar11 = (char *)((byte *)pcVar11 + uVar9 + 1);
              bVar14 = true;
            }
            if (!bVar14) goto LAB_0014b6d1;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0xe);
          local_54 = 0;
LAB_0014b6d1:
          if (local_54 == 0) {
            lj_err_callerv(L,LJ_ERR_JITOPT,__s1);
          }
        }
      }
      bVar14 = narg != iVar3;
      narg = narg + 1;
    } while (bVar14);
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}